

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistoryTree.cpp
# Opt level: O2

void __thiscall JointActionObservationHistoryTree::Print(JointActionObservationHistoryTree *this)

{
  _Base_ptr p_Var1;
  E *this_00;
  _Self __tmp;
  
  if (this->_m_nodeType == A_SUC) {
    if ((this->super_TreeNode<JointActionObservationHistory>)._m_containedElem ==
        (JointActionObservationHistory *)0x0) {
      return;
    }
    std::operator<<((ostream *)&std::cout,"index: ");
    if ((this->super_TreeNode<JointActionObservationHistory>)._m_indexValid == true) {
      std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
    }
    else {
      std::operator<<((ostream *)&std::cout,"INVALID");
    }
    std::operator<<((ostream *)&std::cout," - ");
    (*(((this->super_TreeNode<JointActionObservationHistory>)._m_containedElem)->super_JointHistory)
      .super_History._vptr_History[3])();
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  p_Var1 = (this->super_TreeNode<JointActionObservationHistory>)._m_successor._M_t._M_impl.
           super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 ==
        &(this->super_TreeNode<JointActionObservationHistory>)._m_successor._M_t._M_impl.
         super__Rb_tree_header) {
      return;
    }
    if ((JointActionObservationHistoryTree *)p_Var1[1]._M_parent ==
        (JointActionObservationHistoryTree *)0x0) break;
    Print((JointActionObservationHistoryTree *)p_Var1[1]._M_parent);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "JointActionObservationHistoryTree::Print() - encountereda successor of this JointActionObservationHistoryTree that is 0 (NULL) "
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void JointActionObservationHistoryTree::Print() const
{
    if(_m_nodeType == A_SUC)
    {
        if(_m_containedElem == 0)
            return;    

        cout << "index: ";
        if(_m_indexValid)
            cout<< _m_index;
        else
            cout << "INVALID";
        cout << " - ";
        _m_containedElem->Print();
        cout <<endl;
        
    }
    //in both cases (also if _m_nodeType == O_SUC)
    
    map< LIndex, TreeNode<JointActionObservationHistory>*>::const_iterator
        it = _m_successor.begin();
    while(it != _m_successor.end())
    {
        pair< LIndex, TreeNode<JointActionObservationHistory>*> p = *it;
        TreeNode<JointActionObservationHistory>* suc_tn = p.second;
        //we only put JointActionObservationHistoryTree's as successors, so
        //we can do this:
        JointActionObservationHistoryTree* suc_jaoht =
            static_cast<JointActionObservationHistoryTree*>(suc_tn);
        if(suc_jaoht != 0)
            suc_jaoht->Print();
        else
            throw E("JointActionObservationHistoryTree::Print() - encountered"\
"a successor of this JointActionObservationHistoryTree that is 0 (NULL) ");

        it++;
    }
}